

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsVersion.cpp
# Opt level: O0

string * getHostName_abi_cxx11_(void)

{
  int iVar1;
  char *pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char *temp;
  string *computerName;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  
  std::__cxx11::string::string(in_RDI);
  pcVar2 = getenv("HOSTNAME");
  if (pcVar2 == (char *)0x0) {
    __name = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             operator_new__(0x200);
    this = __name;
    iVar1 = gethostname((char *)__name,0x200);
    if (iVar1 == 0) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(this,in_stack_ffffffffffffffb8);
    }
    if (__name != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete__(__name);
    }
  }
  else {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  return (string *)in_RDI;
}

Assistant:

std::string getHostName()
{
    char* temp{nullptr};
    std::string computerName;

#if defined(WIN32) || defined(_WIN32) || defined(_WIN64)
    temp = getenv("COMPUTERNAME");
    if (temp != nullptr) {
        computerName = temp;
        temp = nullptr;
    }
#else
    temp = getenv("HOSTNAME");
    if (temp != nullptr) {
        computerName = temp;
        temp = nullptr;
    } else {
#    if !defined(__CYGWIN__)
        temp = new char[512];
        if (gethostname(temp, 512) == 0) {  // success = 0, failure = -1
            computerName = temp;
        }
        delete[] temp;
#    endif
        temp = nullptr;
    }
#endif
    return computerName;
}